

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFStream.cxx
# Opt level: O2

int testFStream(int param_1,char **param_2)

{
  uint uVar1;
  BOM BVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  BOM *pBVar6;
  ulong uVar7;
  char *pcVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  undefined1 local_278 [56];
  ifstream in_file;
  char local_230 [16];
  uint auStack_220 [124];
  
  std::ifstream::ifstream((istream *)&in_file,"NoSuchFile.txt",_S_in);
  uVar1 = *(uint *)((long)auStack_220 + *(long *)(_in_file + -0x18));
  std::ifstream::~ifstream((istream *)&in_file);
  pBVar6 = expected_bom;
  puVar9 = file_data[0] + 1;
  lVar10 = 0x137771;
  for (uVar7 = 0; uVar7 != 7; uVar7 = uVar7 + 1) {
    std::ofstream::ofstream((istream *)&in_file,"bom.txt",_S_bin);
    std::ostream::write((char *)&in_file,lVar10);
    std::ostream::write((char *)&in_file,(long)puVar9);
    std::ofstream::~ofstream((istream *)&in_file);
    std::ifstream::ifstream((istream *)&in_file,"bom.txt",_S_bin);
    BVar2 = cmsys::FStream::ReadBOM((istream *)&in_file);
    if (BVar2 != *pBVar6) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Unexpected BOM ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010fcf8:
      std::ifstream::~ifstream(&in_file);
      break;
    }
    std::istream::read((char *)&in_file,(long)local_278);
    if (*(int *)((long)auStack_220 + *(long *)(_in_file + -0x18)) != 0) {
      pcVar8 = "Unable to read data ";
LAB_0010fcda:
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_0010fcf8;
    }
    iVar3 = bcmp(local_278,puVar9,(ulong)(*(uchar (*) [45])(puVar9 + -1))[0]);
    if (iVar3 != 0) {
      pcVar8 = "Incorrect read data ";
      goto LAB_0010fcda;
    }
    std::ifstream::~ifstream((istream *)&in_file);
    pBVar6 = pBVar6 + 1;
    puVar9 = puVar9 + 0x2d;
    lVar10 = lVar10 + 5;
  }
  pBVar6 = expected_bom;
  puVar9 = file_data[0] + 1;
  lVar10 = 0x137771;
  uVar11 = 0;
  do {
    if (uVar11 == 7) {
LAB_0010fe73:
      return (int)((uVar11 < 7 || uVar7 < 7) || (uVar1 & 5) == 0);
    }
    std::fstream::fstream(&in_file,"bomio.txt",_S_trunc|_S_out|_S_in|_S_bin);
    std::ostream::write(local_230,lVar10);
    std::ostream::write(local_230,(long)puVar9);
    iVar3 = (int)uVar11;
    if (*(int *)((long)auStack_220 + *(long *)(_in_file + -0x18)) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Unable to write data ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010fe69:
      std::fstream::~fstream(&in_file);
      goto LAB_0010fe73;
    }
    std::ostream::seekp(local_230,0,0);
    BVar2 = cmsys::FStream::ReadBOM((istream *)&in_file);
    if (BVar2 != *pBVar6) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Unexpected BOM ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_0010fe69;
    }
    std::istream::read((char *)&in_file,(long)local_278);
    if (*(int *)((long)auStack_220 + *(long *)(_in_file + -0x18)) != 0) {
      pcVar8 = "Unable to read data ";
LAB_0010fe4a:
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_0010fe69;
    }
    iVar4 = bcmp(local_278,puVar9,(ulong)(*(uchar (*) [45])(puVar9 + -1))[0]);
    if (iVar4 != 0) {
      pcVar8 = "Incorrect read data ";
      goto LAB_0010fe4a;
    }
    std::fstream::~fstream(&in_file);
    uVar11 = uVar11 + 1;
    pBVar6 = pBVar6 + 1;
    puVar9 = puVar9 + 0x2d;
    lVar10 = lVar10 + 5;
  } while( true );
}

Assistant:

static int testNoFile()
{
  kwsys::ifstream in_file("NoSuchFile.txt");
  if (in_file) {
    return 1;
  }

  return 0;
}